

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6258.c
# Opt level: O0

INT16 clock_adpcm(okim6258_state *chip,UINT8 nibble)

{
  int sample;
  UINT8 nibble_local;
  okim6258_state *chip_local;
  
  chip->signal = (INT16)((uint)(diff_lookup[(int)(chip->step * 0x10 + (nibble & 0xf))] * 0x100 +
                               chip->signal * 0xf5) >> 8);
  if (chip->signal < 0x800) {
    if (chip->signal < -0x800) {
      chip->signal = -0x800;
    }
  }
  else {
    chip->signal = 0x7ff;
  }
  chip->step = chip->step + (short)index_shift[(int)(nibble & 7)];
  if (chip->step < 0x31) {
    if (chip->step < 0) {
      chip->step = 0;
    }
  }
  else {
    chip->step = 0x30;
  }
  return chip->signal;
}

Assistant:

static INT16 clock_adpcm(okim6258_state *chip, UINT8 nibble)
{
	// original MAME algorithm (causes a DC offset over time)
	//chip->signal += diff_lookup[chip->step * 16 + (nibble & 15)];

	// awesome algorithm ported from XM6 - it works PERFECTLY
	int sample = diff_lookup[chip->step * 16 + (nibble & 15)];
	chip->signal = ((sample << 8) + (chip->signal * 245)) >> 8;

	/* clamp to the maximum */
	if (chip->signal > 2047)
		chip->signal = 2047;
	else if (chip->signal < -2048)
		chip->signal = -2048;

	/* adjust the step size and clamp */
	chip->step += index_shift[nibble & 7];
	if (chip->step > 48)
		chip->step = 48;
	else if (chip->step < 0)
		chip->step = 0;

	/* return the signal */
	return chip->signal;
}